

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  Colour guard;
  string local_30;
  
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    guard.m_moved = false;
    Colour::use(BrightYellow);
    poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Filters: ");
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters(&local_30,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar1));
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_30);
    Colour::~Colour(&guard);
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
    if (m_config->testSpec().hasFilters()) {
        Colour guard(Colour::BrightYellow);
        stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
    }
}